

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTargetPropertyCommand.h
# Opt level: O0

cmCommand * __thiscall cmGetTargetPropertyCommand::Clone(cmGetTargetPropertyCommand *this)

{
  cmCommand *this_00;
  cmGetTargetPropertyCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmGetTargetPropertyCommand((cmGetTargetPropertyCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmGetTargetPropertyCommand; }